

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

Token * __thiscall
Tokenizer::parseString(Token *__return_storage_ptr__,Tokenizer *this,char closing)

{
  bool bVar1;
  char cVar2;
  TokenizerException *pTVar3;
  char *pcVar4;
  byte local_1a9;
  tokenValue local_150;
  _Optional_payload_base<char> local_124;
  undefined1 local_122;
  allocator<char> local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  _Optional_payload_base<char> local_bd;
  byte local_bb;
  undefined1 local_ba;
  allocator<char> local_b9;
  undefined1 local_b8 [5];
  bool backslash;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  _Optional_payload_base<char> local_45;
  _Optional_payload_base<char> local_43;
  char local_41;
  undefined1 local_40 [5];
  optional<char> _;
  char c;
  string res;
  char closing_local;
  Tokenizer *this_local;
  
  std::__cxx11::string::string((string *)local_40);
  std::optional<char>::optional((optional<char> *)&local_43);
  local_45 = (_Optional_payload_base<char>)next(this);
  local_43 = local_45;
  bVar1 = std::optional<char>::has_value((optional<char> *)&local_43);
  if (!bVar1) {
    local_ba = 1;
    pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b8,"Expected closing ",&local_b9);
    std::operator+(&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   closing);
    std::operator+(&local_78,&local_98,", got EOF");
    TokenizerException::TokenizerException
              (pTVar3,&local_78,this->line_number,this->col_number,&this->current_line);
    local_ba = 0;
    __cxa_throw(pTVar3,&TokenizerException::typeinfo,TokenizerException::~TokenizerException);
  }
  pcVar4 = std::optional<char>::value((optional<char> *)&local_43);
  local_41 = *pcVar4;
  local_bb = 0;
  while( true ) {
    if ((local_bb & 1) == 0) {
      if (local_41 == '\\') {
        local_bb = 1;
      }
      else {
        local_bb = 0;
        std::__cxx11::string::operator+=((string *)local_40,local_41);
      }
    }
    else {
      local_bb = 0;
      cVar2 = doBackslash(local_41);
      std::__cxx11::string::operator+=((string *)local_40,cVar2);
    }
    local_bd = (_Optional_payload_base<char>)next(this);
    local_43 = local_bd;
    bVar1 = std::optional<char>::has_value((optional<char> *)&local_43);
    if (!bVar1) break;
    pcVar4 = std::optional<char>::value((optional<char> *)&local_43);
    local_41 = *pcVar4;
    local_1a9 = 1;
    if (local_41 == closing) {
      local_1a9 = local_bb;
    }
    if ((local_1a9 & 1) == 0) {
      local_124 = (_Optional_payload_base<char>)next(this);
      std::variant<int,double,std::__cxx11::string,bool,char>::
      variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                ((variant<int,double,std::__cxx11::string,bool,char> *)&local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      Token::Token(__return_storage_ptr__,String,&local_150);
      std::
      variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      ::~variant(&local_150);
      std::__cxx11::string::~string((string *)local_40);
      return __return_storage_ptr__;
    }
  }
  local_122 = 1;
  pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"Expected closing ",&local_121);
  std::operator+(&local_100,&local_120,closing);
  std::operator+(&local_e0,&local_100,", got EOF");
  TokenizerException::TokenizerException
            (pTVar3,&local_e0,this->line_number,this->col_number,&this->current_line);
  local_122 = 0;
  __cxa_throw(pTVar3,&TokenizerException::typeinfo,TokenizerException::~TokenizerException);
}

Assistant:

Token Tokenizer::parseString(char closing) {
    string res;
    char c;
    optional<char> _;
    _ = next();
    if (!_.has_value()) {
        throw TokenizerException(string("Expected closing ") + closing + ", got EOF", line_number, col_number,
                                 current_line);
    }
    c = _.value();
    bool backslash = false;
    do {
        if (backslash) {
            backslash = false;
            res += doBackslash(c);
        } else {
            if (c == '\\')
                backslash = true;
            else {
                backslash = false;
                res += c;
            }
        }
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException(string("Expected closing ") + closing + ", got EOF", line_number, col_number,
                                     current_line);
        }
        c = _.value();
    } while (c != closing || backslash);
    next();
    return Token(String, res);
}